

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O1

void model_rd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
                    int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
                    int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  long lVar3;
  int64_t var;
  byte bVar4;
  long lVar5;
  int64_t iVar6;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int local_9c;
  long local_98;
  long local_90;
  MACROBLOCKD *local_88;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  int64_t *local_58;
  int64_t *local_50;
  int *local_48;
  BLOCK_SIZE (*local_40) [2] [2];
  AV1_COMP *local_38;
  
  if (plane_to < plane_from) {
    local_78 = 0;
    local_68 = 0;
    local_70 = 0;
  }
  else {
    local_60 = (long)(*xd->mi)->ref_frame[0];
    lVar3 = (long)plane_from;
    local_48 = plane_rate + lVar3;
    local_50 = plane_sse + lVar3;
    local_58 = plane_dist + lVar3;
    local_90 = -lVar3;
    p = x->plane + lVar3;
    pd = xd->plane + lVar3;
    local_80 = (ulong)((plane_to - plane_from) + 1);
    lVar3 = 0;
    local_40 = av1_ss_size_lookup + bsize;
    local_70 = 0;
    local_68 = 0;
    local_78 = 0;
    local_88 = xd;
    local_38 = cpi;
    do {
      if ((local_90 != lVar3) && (local_88->is_chroma_ref != true)) break;
      BVar1 = (*local_40)[pd->subsampling_x][pd->subsampling_y];
      var = calculate_sse(local_88,p,pd,(uint)block_size_wide[BVar1],(uint)block_size_high[BVar1]);
      bVar4 = 3;
      if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
        bVar4 = (char)(x->e_mbd).bd - 5;
      }
      if ((local_38->sf).rd_sf.simple_model_rd_from_var == 0) {
        av1_model_rd_from_var_lapndz
                  (var,(uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar1],
                   (int)p->dequant_QTX[1] >> (bVar4 & 0x1f),&local_9c,&local_98);
      }
      else {
        iVar2 = (int)p->dequant_QTX[1] >> (bVar4 & 0x1f);
        lVar5 = 0;
        if ((iVar2 < 0x78) &&
           (lVar5 = (long)((ulong)(0x118 - iVar2) * var) >> 7, 0x7ffffffe < lVar5)) {
          lVar5 = 0x7fffffff;
        }
        local_9c = (int)lVar5;
        local_98 = iVar2 * var >> 8;
      }
      local_98 = local_98 * 0x10;
      if (local_90 == lVar3) {
        iVar6 = 0xffffffff;
        if (var < 0xffffffff) {
          iVar6 = var;
        }
        x->pred_sse[local_60] = (uint)iVar6;
      }
      if (plane_rate != (int *)0x0) {
        local_48[lVar3] = local_9c;
      }
      if (plane_sse != (int64_t *)0x0) {
        local_50[lVar3] = var;
      }
      if (plane_dist != (int64_t *)0x0) {
        local_58[lVar3] = local_98;
      }
      local_78 = local_78 + var;
      local_70 = local_70 + local_9c;
      local_68 = local_68 + local_98;
      lVar3 = lVar3 + 1;
      p = p + 1;
      pd = pd + 1;
    } while ((int)local_80 != (int)lVar3);
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *skip_txfm_sb = local_78 == 0;
  }
  if (skip_sse_sb != (int64_t *)0x0) {
    *skip_sse_sb = local_78 << 4;
  }
  lVar3 = 0x7fffffff;
  if (local_70 < 0x7fffffff) {
    lVar3 = local_70;
  }
  *out_rate_sum = (int)lVar3;
  *out_dist_sum = local_68;
  return;
}

Assistant:

static inline void model_rd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                   MACROBLOCK *x, MACROBLOCKD *xd,
                                   int plane_from, int plane_to,
                                   int *out_rate_sum, int64_t *out_dist_sum,
                                   uint8_t *skip_txfm_sb, int64_t *skip_sse_sb,
                                   int *plane_rate, int64_t *plane_sse,
                                   int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  int plane;
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  assert(bsize < BLOCK_SIZES_ALL);

  for (plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    int64_t sse;
    int rate;
    int64_t dist;

    sse = calculate_sse(xd, p, pd, bw, bh);

    model_rd_from_sse(cpi, x, plane_bsize, plane, sse, bw * bh, &rate, &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;
    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
    assert(rate_sum >= 0);
  }

  if (skip_txfm_sb) *skip_txfm_sb = total_sse == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  rate_sum = AOMMIN(rate_sum, INT_MAX);
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}